

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::CheckProperty(cmTarget *this,string *prop,cmMakefile *context)

{
  bool bVar1;
  char *pcVar2;
  char *value_2;
  char *value_1;
  char *value;
  cmMakefile *context_local;
  string *prop_local;
  cmTarget *this_local;
  
  bVar1 = cmHasLiteralPrefix<std::__cxx11::string,25ul>(prop,(char (*) [25])0x9360f9);
  if ((bVar1) && (pcVar2 = GetProperty(this,prop), pcVar2 != (char *)0x0)) {
    cmTargetCheckLINK_INTERFACE_LIBRARIES(prop,pcVar2,context,false);
  }
  bVar1 = cmHasLiteralPrefix<std::__cxx11::string,34ul>
                    (prop,(char (*) [34])"IMPORTED_LINK_INTERFACE_LIBRARIES");
  if ((bVar1) && (pcVar2 = GetProperty(this,prop), pcVar2 != (char *)0x0)) {
    cmTargetCheckLINK_INTERFACE_LIBRARIES(prop,pcVar2,context,true);
  }
  bVar1 = std::operator==(prop,"INTERFACE_LINK_LIBRARIES");
  if ((bVar1) && (pcVar2 = GetProperty(this,prop), pcVar2 != (char *)0x0)) {
    cmTargetCheckINTERFACE_LINK_LIBRARIES(pcVar2,context);
  }
  bVar1 = std::operator==(prop,"IMPORTED_GLOBAL");
  if ((bVar1) && (bVar1 = IsImported(this), bVar1)) {
    cmTargetCheckIMPORTED_GLOBAL(this,context);
  }
  return;
}

Assistant:

void cmTarget::CheckProperty(const std::string& prop,
                             cmMakefile* context) const
{
  // Certain properties need checking.
  if (cmHasLiteralPrefix(prop, "LINK_INTERFACE_LIBRARIES")) {
    if (const char* value = this->GetProperty(prop)) {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop, value, context, false);
    }
  }
  if (cmHasLiteralPrefix(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES")) {
    if (const char* value = this->GetProperty(prop)) {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop, value, context, true);
    }
  }
  if (prop == "INTERFACE_LINK_LIBRARIES") {
    if (const char* value = this->GetProperty(prop)) {
      cmTargetCheckINTERFACE_LINK_LIBRARIES(value, context);
    }
  }
  if (prop == "IMPORTED_GLOBAL") {
    if (this->IsImported()) {
      cmTargetCheckIMPORTED_GLOBAL(this, context);
    }
  }
}